

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
::moveFromOldBuckets
          (DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
           *this,DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*> *OldBucketsBegin,
          DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*> *OldBucketsEnd)

{
  bool bVar1;
  DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*> *local_30;
  DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*> *ConstFoundBucket;
  
  initEmpty(this);
  if (OldBucketsBegin != OldBucketsEnd) {
    do {
      if ((OldBucketsBegin->super_pair<unsigned_long,_llvm::dwarf::CIE_*>).first <
          0xfffffffffffffffe) {
        bVar1 = LookupBucketFor<unsigned_long>(this,(unsigned_long *)OldBucketsBegin,&local_30);
        if (bVar1) {
          __assert_fail("!FoundVal && \"Key already in new map?\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                        ,0x17a,
                        "void llvm::DenseMapBase<llvm::DenseMap<unsigned long, llvm::dwarf::CIE *>, unsigned long, llvm::dwarf::CIE *, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseMapPair<unsigned long, llvm::dwarf::CIE *>>::moveFromOldBuckets(BucketT *, BucketT *) [DerivedT = llvm::DenseMap<unsigned long, llvm::dwarf::CIE *>, KeyT = unsigned long, ValueT = llvm::dwarf::CIE *, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseMapPair<unsigned long, llvm::dwarf::CIE *>]"
                       );
        }
        (local_30->super_pair<unsigned_long,_llvm::dwarf::CIE_*>).first =
             (OldBucketsBegin->super_pair<unsigned_long,_llvm::dwarf::CIE_*>).first;
        (local_30->super_pair<unsigned_long,_llvm::dwarf::CIE_*>).second =
             (OldBucketsBegin->super_pair<unsigned_long,_llvm::dwarf::CIE_*>).second;
        *(int *)(this + 8) = *(int *)(this + 8) + 1;
      }
      OldBucketsBegin = OldBucketsBegin + 1;
    } while (OldBucketsBegin != OldBucketsEnd);
  }
  return;
}

Assistant:

void moveFromOldBuckets(BucketT *OldBucketsBegin, BucketT *OldBucketsEnd) {
    initEmpty();

    // Insert all the old elements.
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    for (BucketT *B = OldBucketsBegin, *E = OldBucketsEnd; B != E; ++B) {
      if (!KeyInfoT::isEqual(B->getFirst(), EmptyKey) &&
          !KeyInfoT::isEqual(B->getFirst(), TombstoneKey)) {
        // Insert the key/value into the new table.
        BucketT *DestBucket;
        bool FoundVal = LookupBucketFor(B->getFirst(), DestBucket);
        (void)FoundVal; // silence warning.
        assert(!FoundVal && "Key already in new map?");
        DestBucket->getFirst() = std::move(B->getFirst());
        ::new (&DestBucket->getSecond()) ValueT(std::move(B->getSecond()));
        incrementNumEntries();

        // Free the value.
        B->getSecond().~ValueT();
      }
      B->getFirst().~KeyT();
    }
  }